

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

Arg * __thiscall TCLAP::Arg::getDescription_abi_cxx11_(Arg *this)

{
  long in_RSI;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [54];
  allocator local_1a;
  undefined1 local_19;
  Arg *this_local;
  string *desc;
  
  local_19 = 0;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  if ((*(byte *)(in_RSI + 0x68) & 1) != 0) {
    std::operator+((char *)local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(");
    std::operator+(local_50,(char *)local_70);
    std::__cxx11::string::operator=((string *)this,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    std::__cxx11::string::~string(local_70);
  }
  std::__cxx11::string::operator+=((string *)this,(string *)(in_RSI + 0x48));
  return this;
}

Assistant:

inline std::string Arg::getDescription() const
{
	std::string desc = "";
	if ( _required )
		desc = "(" + _requireLabel + ")  ";

//	if ( _valueRequired )
//		desc += "(value required)  ";

	desc += _description;
	return desc;
}